

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

void __thiscall
xLearn::FMScore::calc_grad_ftrl(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  undefined8 uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined4 *puVar13;
  int iVar14;
  index_t d_1;
  ulong uVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  real_t rVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM6 [64];
  allocator_type local_119;
  undefined1 local_118 [16];
  SparseRow *local_108;
  Model *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined4 *local_d8;
  int local_cc;
  undefined1 local_c8 [16];
  long local_b8;
  pointer local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  value_type_conflict1 local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> sv;
  
  auVar31._4_60_ = in_register_00001244;
  auVar31._0_4_ = norm;
  local_108 = row;
  local_100 = model;
  if (norm < 0.0) {
    local_f8._0_4_ = sqrtf(norm);
  }
  else {
    auVar26 = vsqrtss_avx(auVar31._0_16_,auVar31._0_16_);
    local_f8._0_4_ = auVar26._0_4_;
  }
  lVar11 = *(long *)(local_100 + 0x58);
  uVar4 = *(uint *)(local_100 + 0x48);
  for (lVar17 = *(long *)local_108; auVar26 = in_ZMM6._0_16_, lVar17 != *(long *)(local_108 + 8);
      lVar17 = lVar17 + 0xc) {
    uVar5 = *(uint *)(lVar17 + 4);
    if (uVar5 < uVar4) {
      uVar15 = (ulong)(uVar5 * 3);
      uVar12 = (ulong)uVar5 * 3 + 1 & 0xffffffff;
      fVar20 = *(float *)(lVar11 + uVar12 * 4);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(pg * *(float *)(lVar17 + 8) * (float)local_f8._0_4_))
                                ,ZEXT416((uint)(this->super_Score).lambda_2_),
                                ZEXT416(*(uint *)(lVar11 + uVar15 * 4)));
      auVar26 = vfmadd213ss_fma(auVar24,auVar24,ZEXT416((uint)fVar20));
      local_118._0_4_ = auVar24._0_4_;
      fVar19 = auVar26._0_4_;
      *(float *)(lVar11 + uVar12 * 4) = fVar19;
      if (fVar19 < 0.0) {
        local_e8._0_4_ = fVar20;
        fVar19 = sqrtf(fVar19);
        fVar20 = (float)local_e8._0_4_;
      }
      else {
        auVar26 = vsqrtss_avx(auVar26,auVar26);
        fVar19 = auVar26._0_4_;
      }
      if (fVar20 < 0.0) {
        local_e8._0_4_ = fVar19;
        fVar20 = sqrtf(fVar20);
        fVar19 = (float)local_e8._0_4_;
      }
      else {
        auVar26 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
        fVar20 = auVar26._0_4_;
      }
      auVar22._0_4_ = (fVar19 - fVar20) / (this->super_Score).alpha_;
      auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
      uVar10 = (ulong)uVar5 * 3 + 2 & 0xffffffff;
      auVar26 = vfnmadd231ss_fma(ZEXT416((uint)local_118._0_4_),auVar22,
                                 ZEXT416(*(uint *)(lVar11 + uVar15 * 4)));
      fVar19 = auVar26._0_4_ + *(float *)(lVar11 + uVar10 * 4);
      auVar23 = ZEXT816(0);
      uVar7 = vcmpss_avx512f(auVar23,ZEXT416((uint)fVar19),1);
      bVar18 = (bool)((byte)uVar7 & 1);
      *(float *)(lVar11 + uVar10 * 4) = fVar19;
      fVar20 = (this->super_Score).lambda_1_;
      fVar8 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x40800000);
      if (fVar20 < fVar19 * fVar8) {
        fVar21 = *(float *)(lVar11 + uVar12 * 4);
        rVar27 = (this->super_Score).beta_;
        if (fVar21 < 0.0) {
          local_118._0_4_ = fVar19;
          local_e8._0_4_ = fVar20;
          local_c8 = ZEXT416((uint)fVar8);
          local_d8 = (undefined4 *)CONCAT44(local_d8._4_4_,rVar27);
          fVar21 = sqrtf(fVar21);
          rVar27 = local_d8._0_4_;
          fVar20 = (float)local_e8._0_4_;
          auVar26 = local_c8;
          fVar19 = (float)local_118._0_4_;
        }
        else {
          auVar26 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
          fVar21 = auVar26._0_4_;
          auVar26 = ZEXT416((uint)fVar8);
        }
        auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar20),auVar26,ZEXT416((uint)fVar19));
        auVar23._0_4_ =
             auVar26._0_4_ /
             ((rVar27 + fVar21) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
        auVar23._4_12_ = auVar26._4_12_;
      }
      *(int *)(lVar11 + uVar15 * 4) = auVar23._0_4_;
    }
  }
  puVar6 = *(uint **)(local_100 + 0x68);
  fVar20 = (float)puVar6[1];
  auVar24 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar20));
  fVar19 = auVar24._0_4_;
  puVar6[1] = (uint)fVar19;
  if (fVar19 < 0.0) {
    local_118._0_4_ = fVar20;
    fVar19 = sqrtf(fVar19);
    fVar20 = (float)local_118._0_4_;
  }
  else {
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar19 = auVar24._0_4_;
  }
  if (fVar20 < 0.0) {
    local_118._0_4_ = fVar19;
    fVar20 = sqrtf(fVar20);
    fVar19 = (float)local_118._0_4_;
  }
  else {
    auVar24 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
    fVar20 = auVar24._0_4_;
  }
  auVar24._0_4_ = (fVar19 - fVar20) / (this->super_Score).alpha_;
  auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar24 = vfnmadd132ss_fma(auVar24,ZEXT416((uint)pg),ZEXT416(*puVar6));
  auVar28._0_12_ = ZEXT812(0);
  auVar28._12_4_ = 0;
  fVar19 = auVar24._0_4_ + (float)puVar6[2];
  uVar7 = vcmpss_avx512f(auVar28,ZEXT416((uint)fVar19),1);
  bVar18 = (bool)((byte)uVar7 & 1);
  puVar6[2] = (uint)fVar19;
  fVar20 = (this->super_Score).lambda_1_;
  fVar8 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x40800000);
  if (fVar20 < fVar19 * fVar8) {
    auVar24 = vfmsub213ss_fma(ZEXT416((uint)fVar20),ZEXT416((uint)fVar8),ZEXT416((uint)fVar19));
    fVar20 = (float)puVar6[1];
    fVar19 = (this->super_Score).beta_;
    if (fVar20 < 0.0) {
      local_118._0_4_ = auVar24._0_4_;
      local_f8._0_4_ = fVar19;
      fVar20 = sqrtf(fVar20);
      auVar24 = ZEXT416((uint)local_118._0_4_);
    }
    else {
      auVar28 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
      fVar20 = auVar28._0_4_;
      local_f8._0_4_ = fVar19;
    }
    auVar28._0_4_ =
         auVar24._0_4_ /
         (((float)local_f8._0_4_ + fVar20) / (this->super_Score).alpha_ +
         (this->super_Score).lambda_2_);
    auVar28._4_12_ = auVar24._4_12_;
  }
  *puVar6 = auVar28._0_4_;
  auVar24 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)(local_100 + 0x50));
  local_118._0_4_ = (this->super_Score).alpha_;
  local_118._4_4_ = (this->super_Score).beta_;
  local_118._8_4_ = (this->super_Score).lambda_1_;
  local_118._12_4_ = (this->super_Score).lambda_2_;
  auVar24 = ZEXT416((uint)(auVar24._0_4_ * 0.25));
  auVar24 = vroundss_avx(auVar24,auVar24,10);
  iVar16 = vcvttss2usi_avx512f(auVar24);
  uVar15 = (ulong)(uint)(iVar16 * 4);
  auVar24 = vcvtusi2ss_avx512f(auVar26,iVar16 * 4);
  auVar26 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)(local_100 + 0x54));
  local_f8 = *(undefined1 (*) [16])&(this->super_Score).lambda_2_;
  local_8c = 0.0;
  iVar14 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar26._0_4_ * auVar24._0_4_)));
  std::vector<float,_std::allocator<float>_>::vector(&sv,uVar15,&local_8c,&local_119);
  for (lVar11 = *(long *)local_108; lVar11 != *(long *)(local_108 + 8); lVar11 = lVar11 + 0xc) {
    uVar5 = *(uint *)(lVar11 + 4);
    if (uVar5 < uVar4) {
      fVar20 = norm * *(float *)(lVar11 + 8);
      lVar17 = *(long *)(local_100 + 0x60);
      for (uVar12 = 0; uVar12 < uVar15; uVar12 = uVar12 + 4) {
        pfVar1 = (float *)((ulong)(uVar5 * iVar14) * 4 + lVar17 + uVar12 * 4);
        pfVar2 = sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12;
        auVar29._0_4_ = fVar20 * *pfVar1 + *pfVar2;
        auVar29._4_4_ = fVar20 * pfVar1[1] + pfVar2[1];
        auVar29._8_4_ = fVar20 * pfVar1[2] + pfVar2[2];
        auVar29._12_4_ = fVar20 * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])
         (sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start + uVar12) = auVar29;
      }
    }
  }
  local_b0 = sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
  lVar17 = *(long *)local_108;
  local_78 = local_118._0_4_;
  uStack_74 = local_118._0_4_;
  uStack_70 = local_118._0_4_;
  uStack_6c = local_118._0_4_;
  local_88 = (float)local_f8._0_4_;
  fStack_84 = (float)local_f8._0_4_;
  fStack_80 = (float)local_f8._0_4_;
  fStack_7c = (float)local_f8._0_4_;
  local_cc = iVar14;
  for (; lVar17 != lVar11; lVar17 = lVar17 + 0xc) {
    if (*(uint *)(lVar17 + 4) < uVar4) {
      local_68 = norm * *(float *)(lVar17 + 8);
      puVar13 = (undefined4 *)
                ((ulong)(*(uint *)(lVar17 + 4) * iVar14) * 4 + *(long *)(local_100 + 0x60));
      local_58._4_4_ = local_68;
      local_58._0_4_ = local_68;
      fStack_50 = local_68;
      fStack_4c = local_68;
      local_68 = local_68 * pg;
      local_a0 = puVar13 + uVar15;
      local_a8 = puVar13 + (uint)(iVar16 << 3);
      local_b8 = lVar17;
      local_98 = puVar13;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      for (uVar12 = 0; uVar12 < uVar15; uVar12 = uVar12 + 4) {
        pfVar1 = (float *)(local_98 + uVar12);
        fVar20 = *pfVar1;
        fVar19 = pfVar1[1];
        fVar8 = pfVar1[2];
        fVar21 = pfVar1[3];
        auVar33._0_4_ = fVar20 * (float)local_58._0_4_;
        auVar33._4_4_ = fVar19 * (float)local_58._4_4_;
        auVar33._8_4_ = fVar8 * fStack_50;
        auVar33._12_4_ = fVar21 * fStack_4c;
        auVar26 = *(undefined1 (*) [16])(local_a0 + uVar12);
        auVar24 = vsubps_avx(*(undefined1 (*) [16])
                              (sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar12),auVar33);
        auVar25._0_4_ = fVar20 * local_88 + auVar24._0_4_ * local_68;
        auVar25._4_4_ = fVar19 * fStack_84 + auVar24._4_4_ * fStack_64;
        auVar25._8_4_ = fVar8 * fStack_80 + auVar24._8_4_ * fStack_60;
        auVar25._12_4_ = fVar21 * fStack_7c + auVar24._12_4_ * fStack_5c;
        auVar32._0_4_ = auVar26._0_4_ + auVar25._0_4_ * auVar25._0_4_;
        auVar32._4_4_ = auVar26._4_4_ + auVar25._4_4_ * auVar25._4_4_;
        auVar32._8_4_ = auVar26._8_4_ + auVar25._8_4_ * auVar25._8_4_;
        auVar32._12_4_ = auVar26._12_4_ + auVar25._12_4_ * auVar25._12_4_;
        auVar26 = vsqrtps_avx(auVar26);
        auVar24 = vsqrtps_avx(auVar32);
        auVar26 = vsubps_avx(auVar24,auVar26);
        auVar9._4_4_ = uStack_74;
        auVar9._0_4_ = local_78;
        auVar9._8_4_ = uStack_70;
        auVar9._12_4_ = uStack_6c;
        auVar26 = vdivps_avx(auVar26,auVar9);
        auVar30._0_4_ = fVar20 * auVar26._0_4_;
        auVar30._4_4_ = fVar19 * auVar26._4_4_;
        auVar30._8_4_ = fVar8 * auVar26._8_4_;
        auVar30._12_4_ = fVar21 * auVar26._12_4_;
        auVar26 = vsubps_avx(auVar25,auVar30);
        pfVar1 = (float *)(local_a8 + uVar12);
        fVar20 = pfVar1[1];
        fVar19 = pfVar1[2];
        fVar8 = pfVar1[3];
        pfVar2 = (float *)(local_a8 + uVar12);
        *pfVar2 = auVar26._0_4_ + *pfVar1;
        pfVar2[1] = auVar26._4_4_ + fVar20;
        pfVar2[2] = auVar26._8_4_ + fVar19;
        pfVar2[3] = auVar26._12_4_ + fVar8;
        *(undefined1 (*) [16])(local_a0 + uVar12) = auVar32;
        lVar11 = 4;
        local_d8 = puVar13;
        while (bVar18 = lVar11 != 0, lVar11 = lVar11 + -1, bVar18) {
          fVar20 = (float)puVar13[(uint)(iVar16 << 3)];
          auVar26 = ZEXT816(0) << 0x40;
          fVar19 = (this->super_Score).lambda_1_;
          uVar7 = vcmpss_avx512f(auVar26,ZEXT416((uint)fVar20),1);
          bVar18 = (bool)((byte)uVar7 & 1);
          fVar8 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x40800000);
          if (fVar19 < fVar20 * fVar8) {
            fVar21 = (float)puVar13[uVar15];
            fVar3 = (this->super_Score).beta_;
            if (fVar21 < 0.0) {
              local_118._0_4_ = fVar20;
              local_f8._0_4_ = fVar19;
              local_e8 = ZEXT416((uint)fVar8);
              local_c8._0_4_ = fVar3;
              fVar21 = sqrtf(fVar21);
              fVar3 = (float)local_c8._0_4_;
              fVar19 = (float)local_f8._0_4_;
              fVar20 = (float)local_118._0_4_;
              auVar26 = local_e8;
            }
            else {
              auVar26 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
              fVar21 = auVar26._0_4_;
              auVar26 = ZEXT416((uint)fVar8);
            }
            auVar24 = vfmsub213ss_fma(ZEXT416((uint)fVar19),auVar26,ZEXT416((uint)fVar20));
            auVar26._0_4_ =
                 auVar24._0_4_ /
                 ((fVar3 + fVar21) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
            auVar26._4_12_ = auVar24._4_12_;
          }
          *puVar13 = auVar26._0_4_;
          puVar13 = puVar13 + 1;
        }
        puVar13 = local_d8 + 4;
        sv.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = local_b0;
      }
      lVar11 = *(long *)(local_108 + 8);
      lVar17 = local_b8;
      iVar14 = local_cc;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&sv.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void FMScore::calc_grad_ftrl(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }  
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
 for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w_base = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      real_t* w = w_base + d;
      real_t* wg = w_base + aligned_k + d;
      real_t* z = w_base + aligned_k*2 + d;
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w);
      __m128 XMMwg = _mm_load_ps(wg);
      __m128 XMMz = _mm_load_ps(z);
      __m128 XMMg = _mm_add_ps(
                    _mm_mul_ps(XMML2, XMMw),
                    _mm_mul_ps(XMMpgv,
                    _mm_sub_ps(XMMs,
                      _mm_mul_ps(XMMw, XMMv))));
      __m128 XMMsigma = _mm_div_ps(
                        _mm_sub_ps(
                        _mm_sqrt_ps(
                        _mm_add_ps(XMMwg,
                        _mm_mul_ps(XMMg, XMMg))),
                        _mm_sqrt_ps(XMMwg)), XMMalpha);
      XMMz = _mm_add_ps(XMMz,
             _mm_sub_ps(XMMg,
             _mm_mul_ps(XMMsigma, XMMw)));
      _mm_store_ps(z, XMMz);
      XMMwg = _mm_add_ps(XMMwg,
              _mm_mul_ps(XMMg, XMMg));
      _mm_store_ps(wg, XMMwg);
      // Update w. SSE mat not faster.
      for (size_t i = 0; i < kAlign; ++i) {
        real_t z_value = *(z+i);
        int sign = z_value > 0 ? 1:-1;
        if (sign * z_value <= lambda_1_) {
          *(w+i) = 0;
        } else {
          *(w+i) = (sign*lambda_1_-z_value) / 
              ((beta_ + sqrt(*(wg+i))) / alpha_ + lambda_2_);
        }
      }
    }
  }
}